

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O1

int consumesInput(Node *node)

{
  FILE *__stream;
  int iVar1;
  undefined8 extraout_RAX;
  char *pcVar2;
  uint uVar3;
  Node *pNVar4;
  Node *pNVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  char *s;
  ulong uVar6;
  Node *pNVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  uVar3 = 0;
LAB_00104d09:
  if (node != (Node *)0x0) {
    pNVar4 = (Node *)(ulong)(uint)node->type;
    switch(node->type) {
    case 1:
      if (((node->rule).flags & 2U) != 0) {
        consumesInput_cold_1();
        return 0;
      }
      (node->rule).flags = (node->rule).flags | 2;
      iVar1 = consumesInput((node->rule).expression);
      *(byte *)&(node->rule).flags = (byte)(node->rule).flags & 0xfd;
      return iVar1;
    default:
      consumesInput_cold_2();
      uVar10 = 0;
      uVar9 = extraout_RAX;
      for (pNVar5 = rules; pNVar5 != (Node *)0x0; pNVar5 = (pNVar5->rule).next) {
        consumesInput(pNVar5);
      }
      fputs("#ifndef YY_ALLOC\n#define YY_ALLOC(N, D) malloc(N)\n#endif\n#ifndef YY_CALLOC\n#define YY_CALLOC(N, S, D) calloc(N, S)\n#endif\n#ifndef YY_REALLOC\n#define YY_REALLOC(B, N, D) realloc(B, N)\n#endif\n#ifndef YY_FREE\n#define YY_FREE free\n#endif\n#ifndef YY_LOCAL\n#define YY_LOCAL(T)     static T\n#endif\n#ifndef YY_ACTION\n#define YY_ACTION(T)    static T\n#endif\n#ifndef YY_RULE\n#define YY_RULE(T)      static T\n#endif\n#ifndef YY_PARSE\n#define YY_PARSE(T)     T\n#endif\n#ifndef YY_NAME\n#define YY_NAME(N) yy##N\n#endif\n#ifndef YY_INPUT\n#define YY_INPUT(buf, result, max_size, D)\t\t\\\n  {\t\t\t\t\t\t\t\\\n    int yyc= getchar();\t\t\t\t\t\\\n    result= (EOF == yyc) ? 0 : (*(buf)= yyc, 1);\t\\\n    yyprintf((stderr, \"<%c>\", yyc));\t\t\t\\\n  }\n#endif\n#ifndef YY_BEGIN\n#define YY_BEGIN        ( G->begin= G->pos, 1)\n#endif\n#ifndef YY_END\n#define YY_END          ( G->end= G->pos, 1)\n#endif\n#ifdef YY_DEBUG\n# ifndef DEBUG_PARSE\n#  define DEBUG_PARSE   1\n# endif\n# ifndef DEBUG_VERBOSE\n#  define DEBUG_VERBOSE 2\n# endif\n# define yyprintf(args)\t         if (G->debug & DEBUG_PARSE)         fprintf args\n# define yyprintfv(args)         if (G->debug == (DEBUG_PARSE|DEBUG_VERBOSE)) fprintf args\n# define yyprintfGcontext        if (G->debug & DEBUG_PARSE)         yyprintcontext(stderr,G->buf+G->pos)\n# define yyprintfvGcontext       if (G->debug == (DEBUG_PARSE|DEBUG_VERBOSE)) yyprintcontext(stderr,G->buf+G->pos)\n# define yyprintfvTcontext(text) if (G->debug == (DEBUG_PARSE|DEBUG_VERBOSE)) yyprintcontext(stderr,text)\n#else\n# define yyprintf(args)\n# define yyprintfv(args)\n# define yyprintfGcontext\n# define yyprintfvGcontext\n# define yyprintfvTcontext(text)\n#endif\n#ifndef YYSTYPE\n#define YYSTYPE int\n#endif\n#ifndef YY_XTYPE\n#define YY_XTYPE void *\n#endif\n#ifndef YY_XVAR\n#define YY_XVAR yyxvar\n#endif\n\n#ifndef YY_STACK_SIZE\n#define YY_STACK_SIZE 128\n#endif\n\n#ifndef YY_BUFFER_START_SIZE\n#define YY_BUFFER_START_SIZE 1024\n#endif\n\n#ifndef YY_PART\n#define yydata G->data\n#define yy G->ss\n\nstruct _yythunk; /* forward declaration */\ntypedef void (*yyaction)(struct _GREG *G, char *yytext, in..." /* TRUNCATED STRING LITERAL */
            ,(FILE *)output);
      for (pNVar5 = pNVar4; pNVar5 != (Node *)0x0; pNVar5 = (pNVar5->rule).next) {
        fprintf((FILE *)output,"YY_RULE(int) yy_%s(GREG *G); /* %d */\n",(pNVar5->rule).name,
                (ulong)(uint)(pNVar5->rule).id,in_R8,in_R9,uVar9,uVar10);
      }
      fputc(10,(FILE *)output);
      for (pNVar5 = actions; pNVar5 != (Node *)0x0; pNVar5 = (pNVar5->rule).variables) {
        s = (pNVar5->rule).name;
        fprintf((FILE *)output,
                "YY_ACTION(void) yy%s(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)\n{\n"
                ,(pNVar5->rule).expression);
        pNVar7 = (((pNVar5->action).rule)->rule).variables;
        if (pNVar7 != (Node *)0x0) {
          uVar6 = 0xffffffff;
          do {
            fprintf((FILE *)output,"#define %s G->val[%d]\n",(pNVar7->rule).name,uVar6);
            (pNVar7->variable).offset = (int)uVar6;
            pNVar7 = (pNVar7->rule).next;
            uVar6 = (ulong)((int)uVar6 - 1);
          } while (pNVar7 != (Node *)0x0);
        }
        for (; (*s == ' ' || (*s == '\t')); s = s + 1) {
        }
        fprintf((FILE *)output,"  yyprintf((stderr, \"do yy%s\"));\n",(pNVar5->rule).expression);
        fwrite("  yyprintfvTcontext(yytext);\n",0x1d,1,(FILE *)output);
        __stream = output;
        pcVar2 = yyqq(s);
        fprintf((FILE *)__stream,"  yyprintf((stderr, \"\\n  {%s}\\n\"));\n",pcVar2);
        fprintf((FILE *)output,"  %s;\n",s);
        for (pNVar7 = (((pNVar5->action).rule)->rule).variables; pNVar7 != (Node *)0x0;
            pNVar7 = (pNVar7->rule).next) {
          fprintf((FILE *)output,"#undef %s\n",(pNVar7->rule).name);
        }
        fwrite("}\n",2,1,(FILE *)output);
      }
      Rule_compile_c2(pNVar4);
      iVar1 = fprintf((FILE *)output,
                      "\n\n#ifndef YY_PART\n\ntypedef int (*yyrule)(GREG *G);\n\nYY_PARSE(int) YY_NAME(parse_from)(GREG *G, yyrule yystart)\n{\n  int yyok;\n  if (!G->buflen)\n    {\n      G->buflen= YY_BUFFER_START_SIZE;\n      G->buf= (char*)YY_ALLOC(G->buflen, G->data);\n      G->textlen= YY_BUFFER_START_SIZE;\n      G->text= (char*)YY_ALLOC(G->textlen, G->data);\n      G->thunkslen= YY_STACK_SIZE;\n      G->thunks= (yythunk*)YY_ALLOC(sizeof(yythunk) * G->thunkslen, G->data);\n      G->valslen= YY_STACK_SIZE;\n      G->vals= (YYSTYPE*)YY_ALLOC(sizeof(YYSTYPE) * G->valslen, G->data);\n      G->begin= G->end= G->pos= G->limit= G->thunkpos= 0;\n    }\n  G->pos = 0;\n  G->begin= G->end= G->pos;\n  G->thunkpos= 0;\n  G->val= G->vals;\n  yyok= yystart(G);\n  if (yyok) yyDone(G);\n  yyCommit(G);\n  return yyok;\n  (void)yyrefill;\n  (void)yymatchDot;\n  (void)yymatchChar;\n  (void)yymatchString;\n  (void)yymatchClass;\n  (void)yyDo;\n  (void)yyText;\n  (void)yyDone;\n  (void)yyCommit;\n  (void)yyAccept;\n  (void)yyPush;\n  (void)yyPop;\n  (void)yySet;\n}\n\nYY_PARSE(int) YY_NAME(parse)(GREG *G)\n{\n  return YY_NAME(parse_from)(G, yy_%s);\n}\n\nYY_PARSE(void) YY_NAME(init)(GREG *G)\n{\n    memset(G, 0, sizeof(GREG));\n}\nYY_PARSE(void) YY_NAME(deinit)(GREG *G)\n{\n    if (G->buf) YY_FREE(G->buf);\n    if (G->text) YY_FREE(G->text);\n    if (G->thunks) YY_FREE(G->thunks);\n    if (G->vals) YY_FREE((void*)G->vals);\n}\nYY_PARSE(GREG *) YY_NAME(parse_new)(YY_XTYPE data)\n{\n  GREG *G = (GREG *)YY_CALLOC(1, sizeof(GREG), G->data);\n  G->data = data;\n  return G;\n}\n\nYY_PARSE(void) YY_NAME(parse_free)(GREG *G)\n{\n  YY_NAME(deinit)(G);\n  YY_FREE(G);\n}\n\n#endif\n"
                      ,(start->rule).name);
      return iVar1;
    case 3:
    case 0x10:
      goto switchD_00104d28_caseD_3;
    case 4:
    case 7:
      return 1;
    case 5:
    case 6:
      return (uint)(*(node->rule).name != '\0');
    case 8:
    case 9:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      goto switchD_00104d28_caseD_8;
    case 10:
      pNVar4 = (node->name).rule;
      while ((bVar8 = pNVar4 == (Node *)0x0, !bVar8 && (iVar1 = consumesInput(pNVar4), iVar1 != 0)))
      {
        pNVar4 = (pNVar4->rule).next;
      }
      break;
    case 0xb:
      pNVar4 = (node->name).rule;
      while ((bVar8 = pNVar4 != (Node *)0x0, bVar8 && (iVar1 = consumesInput(pNVar4), iVar1 == 0)))
      {
        pNVar4 = (pNVar4->rule).next;
      }
    }
    uVar3 = (uint)bVar8;
  }
switchD_00104d28_caseD_8:
  return uVar3;
switchD_00104d28_caseD_3:
  node = (Node *)(node->rule).name;
  goto LAB_00104d09;
}

Assistant:

int consumesInput(Node *node)
{
  if (!node) return 0;

  switch (node->type)
    {
    case Rule:
      {
        int result= 0;
        if (RuleReached & node->rule.flags)
          fprintf(stderr, "possible infinite left recursion in rule '%s'\n", node->rule.name);
        else
          {
            node->rule.flags |= RuleReached;
            result= consumesInput(node->rule.expression);
            node->rule.flags &= ~RuleReached;
          }
        return result;
      }
      break;

    case Dot:           return 1;
    case Name:          return consumesInput(node->name.rule);
    case Character:
    case String:        return strlen(node->string.value) > 0;
    case Class:         return 1;
    case Action:        return 0;
    case Predicate:     return 0;

    case Alternate:
      {
        Node *n;
        for (n= node->alternate.first;  n;  n= n->alternate.next)
          if (!consumesInput(n))
            return 0;
      }
      return 1;

    case Sequence:
      {
        Node *n;
        for (n= node->alternate.first;  n;  n= n->alternate.next)
          if (consumesInput(n))
            return 1;
      }
      return 0;

    case PeekFor:       return 0;
    case PeekNot:       return 0;
    case Query:         return 0;
    case Star:          return 0;
    case Plus:          return consumesInput(node->plus.element);

    default:
      fprintf(stderr, "\nconsumesInput: illegal node type %d\n", node->type);
      exit(1);
    }
  return 0;
}